

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void statlist(LexState *ls)

{
  int iVar1;
  LexState *ls_local;
  
  while( true ) {
    iVar1 = block_follow(ls,1);
    if (iVar1 != 0) {
      return;
    }
    if ((ls->t).token == 0x113) break;
    statement(ls);
  }
  statement(ls);
  return;
}

Assistant:

static void statlist (LexState *ls) {
  /* statlist -> { stat [';'] } */
  while (!block_follow(ls, 1)) {
    if (ls->t.token == TK_RETURN) {
      statement(ls);
      return;  /* 'return' must be last statement */
    }
    statement(ls);
  }
}